

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

ProStringList * __thiscall
MakefileGenerator::createObjectList
          (ProStringList *__return_storage_ptr__,MakefileGenerator *this,ProStringList *sources)

{
  QMakeProject *pQVar1;
  long lVar2;
  QString file;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  ProStringList *pPVar8;
  ProString *pPVar9;
  qsizetype qVar10;
  __mode_t __mode;
  QString *pQVar11;
  ProString *this_00;
  MakefileGenerator *this_01;
  long in_FS_OFFSET;
  MakefileGenerator *this_02;
  QArrayDataPointer<char16_t> local_158;
  QStringBuilder<QString_&,_QString> local_138;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  QFileInfo fi;
  QArrayDataPointer<char16_t> local_d8;
  undefined1 local_b8 [16];
  SourceFiles *local_a8;
  QString *local_98;
  ProString local_88;
  QArrayDataPointer<char16_t> local_58;
  QHash<QString,_bool> local_38;
  
  local_38.d = *(Data **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super_QList<ProString>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.ptr = (ProString *)0x0;
  (__return_storage_ptr__->super_QList<ProString>).d.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  pQVar1 = this->project;
  ProKey::ProKey((ProKey *)&local_88,"OBJECTS_DIR");
  pPVar8 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_88);
  lVar2 = (pPVar8->super_QList<ProString>).d.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  if (lVar2 != 0) {
    pQVar1 = this->project;
    ProKey::ProKey((ProKey *)local_b8,"OBJECTS_DIR");
    QMakeEvaluator::first(&local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_b8);
    ProString::toQString((QString *)&local_138,&local_88);
    local_58.ptr = (char16_t *)local_138.b.d.d;
    local_58.d = (Data *)local_138.a;
    local_138.a = (QString *)0x0;
    local_138.b.d.d = (Data *)0x0;
    local_58.size = (qsizetype)local_138.b.d.ptr;
    local_138.b.d.ptr = (char16_t *)0x0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
  }
  pPVar9 = (sources->super_QList<ProString>).d.ptr;
  for (this_00 = pPVar9; this_00 != pPVar9 + (sources->super_QList<ProString>).d.size;
      this_00 = this_00 + 1) {
    local_d8.size = -0x5555555555555556;
    local_d8.d._0_4_ = 0xaaaaaaaa;
    local_d8.d._4_4_ = 0xaaaaaaaa;
    local_d8.ptr._0_4_ = 0xaaaaaaaa;
    local_d8.ptr._4_4_ = 0xaaaaaaaa;
    this_02 = this;
    ProString::toQString((QString *)&local_d8,this_00);
    _fi = (_func_int **)0xaaaaaaaaaaaaaaaa;
    Option::normalizePath((QString *)&local_f8,(QString *)&local_d8,true,true);
    file.d.ptr = (char16_t *)sources;
    file.d.d = (Data *)this_02;
    file.d.size = (qsizetype)__return_storage_ptr__;
    fileInfo((MakefileGenerator *)&fi,file);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    local_118.d = (Data *)0x0;
    local_118.ptr = (char16_t *)0x0;
    local_118.size = 0;
    pQVar1 = this->project;
    QString::QString(&local_88.m_string,"object_parallel_to_source");
    bVar5 = QMakeProject::isActiveConfig(pQVar1,&local_88.m_string,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    if (bVar5) {
      local_88.m_string.d.size = -0x5555555555555556;
      local_88.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_88.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      fileFixify(&local_88.m_string,this,(QString *)&local_d8,(FileFixifyTypes)0x3,true);
      local_138.a = (QString *)0x220ac4;
      local_138.b.d.d = (Data *)&Option::dir_sep;
      QStringBuilder<const_char_(&)[3],_QString_&>::convertTo<QString>
                ((QString *)local_b8,(QStringBuilder<const_char_(&)[3],_QString_&> *)&local_138);
      cVar6 = QString::startsWith((QString *)&local_88,
                                  (CaseSensitivity)(MakefileGenerator *)local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
      if (cVar6 != '\0') {
        fileFixify((QString *)local_b8,this_02,&local_88.m_string,(FileFixifyTypes)0x4,true);
        qVar10 = local_88.m_string.d.size;
        pcVar4 = local_88.m_string.d.ptr;
        pDVar3 = local_88.m_string.d.d;
        local_88.m_string.d.d = (Data *)local_b8._0_8_;
        local_88.m_string.d.ptr = (char16_t *)local_b8._8_8_;
        local_b8._0_8_ = pDVar3;
        local_b8._8_8_ = pcVar4;
        local_88.m_string.d.size = (qsizetype)local_a8;
        local_a8 = (SourceFiles *)qVar10;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
      }
      bVar5 = QDir::isAbsolutePath(&local_88.m_string);
      if (bVar5) {
        QString::indexOf((QString *)&local_88,0x26bbd0,CaseInsensitive);
        QString::remove((longlong)&local_88,0);
      }
      QString::operator=((QString *)&local_118,(QString *)&local_58);
      qVar10 = QString::lastIndexOf(&local_88.m_string,&Option::dir_sep,CaseSensitive);
      if ((int)qVar10 != -1) {
        QString::append((QChar *)&local_118,(longlong)local_88.m_string.d.ptr);
      }
      if (this_02->no_io == false) {
        local_a8 = (SourceFiles *)0xaaaaaaaaaaaaaaaa;
        local_b8._0_8_ = (QMakeLocalFileName *)0xaaaaaaaaaaaaaaaa;
        local_b8._8_8_ = (SourceFiles *)0xaaaaaaaaaaaaaaaa;
        this_01 = (MakefileGenerator *)local_b8;
        fileFixify((QString *)local_b8,this_02,(QString *)&local_118,(FileFixifyTypes)0x3,true);
        if ((local_a8 != (SourceFiles *)0x0) &&
           (iVar7 = mkdir(this_01,(char *)local_b8,__mode), (char)iVar7 == '\0')) {
          QString::toLatin1_helper((QString *)&local_138);
          pQVar11 = (QString *)local_138.b.d.d;
          if ((QString *)local_138.b.d.d == (QString *)0x0) {
            pQVar11 = (QString *)&QByteArray::_empty;
          }
          warn_msg(WarnLogic,"Cannot create directory \'%s\'",pQVar11);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_138);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    }
    else {
      QString::operator=((QString *)&local_118,(QString *)&local_58);
    }
    QFileInfo::completeBaseName();
    local_138.b.d.size = local_158.size;
    local_138.b.d.ptr = local_158.ptr;
    local_138.b.d.d = local_158.d;
    local_158.d = (Data *)0x0;
    local_158.ptr = (char16_t *)0x0;
    local_158.size = 0;
    local_138.a = (QString *)&local_118;
    QStringBuilder<QString_&,_QString>::QStringBuilder
              ((QStringBuilder<QString_&,_QString> *)local_b8,&local_138);
    local_98 = &Option::obj_ext;
    ProString::ProString<QStringBuilder<QString&,QString>,QString&>
              (&local_88,(QStringBuilder<QStringBuilder<QString_&,_QString>,_QString_&> *)local_b8);
    QList<ProString>::emplaceBack<ProString>
              (&__return_storage_ptr__->super_QList<ProString>,&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_b8 + 8));
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138.b.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
    QFileInfo::~QFileInfo(&fi);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    pPVar9 = (sources->super_QList<ProString>).d.ptr;
    this = this_02;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38.d) {
    return (ProStringList *)&__return_storage_ptr__->super_QList<ProString>;
  }
  __stack_chk_fail();
}

Assistant:

ProStringList
MakefileGenerator::createObjectList(const ProStringList &sources)
{
    ProStringList ret;
    QString objdir;
    if(!project->values("OBJECTS_DIR").isEmpty())
        objdir = project->first("OBJECTS_DIR").toQString();
    for (ProStringList::ConstIterator it = sources.begin(); it != sources.end(); ++it) {
        QString sfn = (*it).toQString();
        QFileInfo fi(fileInfo(Option::normalizePath(sfn)));
        QString dir;
        if (project->isActiveConfig("object_parallel_to_source")) {
            // The source paths are relative to the output dir, but we need source-relative paths
            QString sourceRelativePath = fileFixify(sfn, FileFixifyBackwards);

            if (sourceRelativePath.startsWith(".." + Option::dir_sep))
                sourceRelativePath = fileFixify(sourceRelativePath, FileFixifyAbsolute);

            if (QDir::isAbsolutePath(sourceRelativePath))
                sourceRelativePath.remove(0, sourceRelativePath.indexOf(Option::dir_sep) + 1);

            dir = objdir; // We still respect OBJECTS_DIR

            int lastDirSepPosition = sourceRelativePath.lastIndexOf(Option::dir_sep);
            if (lastDirSepPosition != -1)
                dir += QStringView{sourceRelativePath}.left(lastDirSepPosition + 1);

            if (!noIO()) {
                // Ensure that the final output directory of each object exists
                QString outRelativePath = fileFixify(dir, FileFixifyBackwards);
                if (!outRelativePath.isEmpty() && !mkdir(outRelativePath))
                    warn_msg(WarnLogic, "Cannot create directory '%s'", outRelativePath.toLatin1().constData());
            }
        } else {
            dir = objdir;
        }
        ret.append(dir + fi.completeBaseName() + Option::obj_ext);
    }
    return ret;
}